

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O1

int __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__from,char *__to)

{
  undefined4 *puVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int extraout_EAX;
  long lVar5;
  LinkType *pLVar6;
  ulong *puVar7;
  ulong uVar8;
  
  lVar4 = this[2].rootNode[1];
  lVar5 = (long)__from * 0x90;
  puVar7 = (ulong *)(lVar4 + lVar5 + 0x70);
  *puVar7 = (ulong)(__to + 1) | *puVar7 & 0x8000000000000000;
  if (__to == (char *)0xffffffffffffffff) {
    pLVar6 = this->rootNode;
  }
  else {
    dVar2 = *(double *)(lVar4 + 0x48 + (long)__to * 0x90);
    dVar3 = *(double *)(lVar4 + 0x48 + lVar5);
    uVar8 = 1;
    if ((dVar3 <= dVar2) && (uVar8 = 0, dVar2 <= dVar3)) {
      uVar8 = (ulong)((long)__to < (long)__from);
    }
    pLVar6 = (LinkType *)((long)__to * 0x90 + lVar4 + uVar8 * 8 + 0x60);
  }
  *pLVar6 = (LinkType)__from;
  puVar1 = (undefined4 *)(lVar4 + 0x60 + lVar5);
  *puVar1 = 0xffffffff;
  puVar1[1] = 0xffffffff;
  puVar1[2] = 0xffffffff;
  puVar1[3] = 0xffffffff;
  *puVar7 = *puVar7 | 0x8000000000000000;
  insertFixup(this,(LinkType)__from);
  return extraout_EAX;
}

Assistant:

RbTreeLinks<int64_t>& getRbTreeLinks(int64_t node) {
    return nodeQueue->nodes[node].lowerLinks;
  }